

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule(cmNinjaNormalTargetGenerator *this,bool useResponseFile)

{
  bool bVar1;
  TargetType TVar2;
  TargetType targetType_00;
  int iVar3;
  cmGeneratorTarget *pcVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar6;
  char *pcVar7;
  undefined4 extraout_var;
  reference pbVar8;
  cmRulePlaceholderExpander *this_01;
  ostream *poVar9;
  string *source;
  cmOutputConverter *local_eb8;
  allocator local_de9;
  string local_de8;
  allocator local_dc1;
  string local_dc0;
  allocator local_d99;
  string local_d98;
  allocator local_d71;
  string local_d70;
  allocator local_d49;
  string local_d48;
  allocator local_d21;
  string local_d20;
  allocator local_cf9;
  string local_cf8;
  string local_cd8;
  allocator local_cb1;
  string local_cb0;
  allocator local_c89;
  value_type local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  undefined1 local_c48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines_1;
  string local_c28;
  allocator local_c01;
  string local_c00;
  allocator local_bd9;
  string local_bd8;
  allocator local_bb1;
  string local_bb0;
  allocator local_b89;
  string local_b88;
  allocator local_b61;
  string local_b60;
  allocator local_b39;
  string local_b38;
  string local_b18;
  allocator local_af1;
  string local_af0;
  allocator local_ac9;
  value_type local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  undefined1 local_a88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandLines;
  string cmakeCommand;
  string local_a48;
  allocator local_a21;
  string local_a20;
  allocator local_9f9;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  undefined1 local_998 [8];
  ostringstream description;
  undefined1 local_820 [8];
  ostringstream comment;
  undefined1 local_6a8 [8];
  string linkCmd;
  value_type local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_660;
  allocator local_651;
  value_type local_650;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_630;
  const_iterator local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f0;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string local_5c0;
  char *local_5a0;
  char *val;
  string launcher;
  string langFlags;
  string local_538 [32];
  int local_518;
  int local_514;
  int minor;
  int major;
  ostringstream minorStream;
  ostringstream local_398 [8];
  ostringstream majorStream;
  string local_220 [8];
  string targetVersionMinor;
  string targetVersionMajor;
  char *flag;
  string cmakeLinkVar;
  undefined1 local_1b0 [8];
  string cmakeVarLang;
  string responseFlag;
  RuleVariables vars;
  undefined1 local_78 [8];
  string rspcontent;
  string rspfile;
  string ruleName;
  TargetType targetType;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TVar2 = cmGeneratorTarget::GetType(pcVar4);
  LanguageLinkerRule_abi_cxx11_((string *)((long)&rspfile.field_2 + 8),this);
  std::__cxx11::string::string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar5,(string *)((long)&rspfile.field_2 + 8));
  if (!bVar1) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&responseFlag.field_2 + 8));
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    responseFlag.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    targetType_00 = cmGeneratorTarget::GetType(pcVar4);
    cmState::GetTargetTypeName(targetType_00);
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
    if (useResponseFile) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1b0,"CMAKE_",(allocator *)(cmakeLinkVar.field_2._M_local_buf + 0xf)
                );
      std::allocator<char>::~allocator((allocator<char> *)(cmakeLinkVar.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_1b0,(string *)&this->TargetLinkLanguage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flag,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     "_RESPONSE_FILE_LINK_FLAG");
      this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
      pcVar7 = cmMakefile::GetDefinition(this_00,(string *)&flag);
      if (pcVar7 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),"@");
      }
      else {
        std::__cxx11::string::operator=((string *)(cmakeVarLang.field_2._M_local_buf + 8),pcVar7);
      }
      std::__cxx11::string::operator=((string *)(rspcontent.field_2._M_local_buf + 8),"$RSP_FILE");
      std::__cxx11::string::operator+=
                ((string *)(cmakeVarLang.field_2._M_local_buf + 8),
                 (string *)(rspcontent.field_2._M_local_buf + 8));
      pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar5);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_78,"$in");
      }
      else {
        std::__cxx11::string::operator=((string *)local_78,"$in_newline");
      }
      std::__cxx11::string::operator+=((string *)local_78," $LINK_PATH $LINK_LIBRARIES");
      std::__cxx11::string::c_str();
      std::__cxx11::string::~string((string *)&flag);
      std::__cxx11::string::~string((string *)local_1b0);
    }
    std::__cxx11::string::string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_220);
    std::__cxx11::ostringstream::ostringstream(local_398);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&minor);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetTargetVersion(pcVar4,&local_514,&local_518);
    std::ostream::operator<<(local_398,local_514);
    std::ostream::operator<<(&minor,local_518);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)(targetVersionMinor.field_2._M_local_buf + 8),local_538);
    std::__cxx11::string::~string(local_538);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_220,(string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(langFlags.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&minor);
    std::__cxx11::ostringstream::~ostringstream(local_398);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)(launcher.field_2._M_local_buf + 8));
    if (TVar2 != EXECUTABLE) {
      std::__cxx11::string::operator+=
                ((string *)(launcher.field_2._M_local_buf + 8),"$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS"
                );
      std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_5c0,"RULE_LAUNCH_LINK",
               (allocator *)((long)&rulePlaceholderExpander.x_ + 7));
    pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar6,pcVar4,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rulePlaceholderExpander.x_ + 7));
    local_5a0 = pcVar7;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      std::__cxx11::string::operator=((string *)&val,pcVar7);
      std::__cxx11::string::operator+=((string *)&val," ");
    }
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar3 = (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    ::cm::auto_ptr<cmRulePlaceholderExpander>::auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)
               &linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3));
    ComputeLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,this);
    local_5f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      local_5f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar1 = __gnu_cxx::operator!=(&local_5f0,&local_5f8);
      if (!bVar1) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_5f0);
      std::operator+(&local_618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     pbVar8);
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_5f0);
      std::__cxx11::string::operator=((string *)pbVar8,(string *)&local_618);
      std::__cxx11::string::~string((string *)&local_618);
      this_01 = ::cm::auto_ptr<cmRulePlaceholderExpander>::operator->
                          ((auto_ptr<cmRulePlaceholderExpander> *)
                           &linkCmds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_eb8 = (cmOutputConverter *)0x0;
      if (pcVar6 != (cmLocalNinjaGenerator *)0x0) {
        local_eb8 = &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_5f0);
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_eb8,pbVar8,(RuleVariables *)((long)&responseFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_5f0);
    }
    cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmNinjaRemoveNoOpCommands>
              (&i);
    local_630._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_628,&local_630);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_650,"$PRE_LINK",&local_651);
    local_660 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&i,local_628,&local_650);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_680,"$POST_BUILD",(allocator *)(linkCmd.field_2._M_local_buf + 0xf))
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator((allocator<char> *)(linkCmd.field_2._M_local_buf + 0xf));
    pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_6a8,pcVar6,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_820);
    poVar9 = std::operator<<((ostream *)local_820,"Rule for linking ");
    poVar9 = std::operator<<(poVar9,(string *)&this->TargetLinkLanguage);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
    poVar9 = std::operator<<((ostream *)local_998,"Linking ");
    poVar9 = std::operator<<(poVar9,(string *)&this->TargetLinkLanguage);
    poVar9 = std::operator<<(poVar9," ");
    pcVar7 = GetVisibleTypeName(this);
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9," $TARGET_FILE");
    pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f8,"",&local_9f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a20,"",&local_a21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a48,"$RESTAT",(allocator *)(cmakeCommand.field_2._M_local_buf + 0xf)
              );
    cmGlobalNinjaGenerator::AddRule
              (pcVar5,(string *)((long)&rspfile.field_2 + 8),(string *)local_6a8,&local_9b8,
               &local_9d8,&local_9f8,&local_a20,(string *)((long)&rspcontent.field_2 + 8),
               (string *)local_78,&local_a48,false);
    std::__cxx11::string::~string((string *)&local_a48);
    std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator((allocator<char> *)&local_a21);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_820);
    std::__cxx11::string::~string((string *)local_6a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)
               &linkCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string((string *)(targetVersionMinor.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cmakeVarLang.field_2._M_local_buf + 8));
  }
  bVar1 = std::operator!=(&this->TargetNameOut,&this->TargetNameReal);
  if (bVar1) {
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(pcVar4);
    if (!bVar1) {
      pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                ((string *)
                 &commandLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
      if (TVar2 == EXECUTABLE) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a88);
        std::operator+(&local_aa8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &commandLines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       " -E cmake_symlink_executable $in $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a88,&local_aa8);
        std::__cxx11::string::~string((string *)&local_aa8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ac8,"$POST_BUILD",&local_ac9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a88,&local_ac8);
        std::__cxx11::string::~string((string *)&local_ac8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_af0,"CMAKE_SYMLINK_EXECUTABLE",&local_af1);
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_b18,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a88);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b38,"Creating executable symlink $out",&local_b39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b60,"Rule for creating executable symlink.",&local_b61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b88,"",&local_b89);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_bb0,"",&local_bb1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_bd8,"",&local_bd9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c00,"",&local_c01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c28,"",
                   (allocator *)
                   ((long)&commandLines_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmGlobalNinjaGenerator::AddRule
                  (pcVar5,&local_af0,&local_b18,&local_b38,&local_b60,&local_b88,&local_bb0,
                   &local_bd8,&local_c00,&local_c28,false);
        std::__cxx11::string::~string((string *)&local_c28);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&commandLines_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_c00);
        std::allocator<char>::~allocator((allocator<char> *)&local_c01);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
        std::__cxx11::string::~string((string *)&local_bb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator((allocator<char> *)&local_b89);
        std::__cxx11::string::~string((string *)&local_b60);
        std::allocator<char>::~allocator((allocator<char> *)&local_b61);
        std::__cxx11::string::~string((string *)&local_b38);
        std::allocator<char>::~allocator((allocator<char> *)&local_b39);
        std::__cxx11::string::~string((string *)&local_b18);
        std::__cxx11::string::~string((string *)&local_af0);
        std::allocator<char>::~allocator((allocator<char> *)&local_af1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a88);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c48);
        std::operator+(&local_c68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &commandLines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       " -E cmake_symlink_library $in $SONAME $out");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c48,&local_c68);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c88,"$POST_BUILD",&local_c89);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c48,&local_c88);
        std::__cxx11::string::~string((string *)&local_c88);
        std::allocator<char>::~allocator((allocator<char> *)&local_c89);
        pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_cb0,"CMAKE_SYMLINK_LIBRARY",&local_cb1);
        pcVar6 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        cmLocalNinjaGenerator::BuildCommandLine
                  (&local_cd8,pcVar6,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_cf8,"Creating library symlink $out",&local_cf9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d20,"Rule for creating library symlink.",&local_d21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d48,"",&local_d49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d70,"",&local_d71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d98,"",&local_d99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_dc0,"",&local_dc1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_de8,"",&local_de9);
        cmGlobalNinjaGenerator::AddRule
                  (pcVar5,&local_cb0,&local_cd8,&local_cf8,&local_d20,&local_d48,&local_d70,
                   &local_d98,&local_dc0,&local_de8,false);
        std::__cxx11::string::~string((string *)&local_de8);
        std::allocator<char>::~allocator((allocator<char> *)&local_de9);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
        std::__cxx11::string::~string((string *)&local_d98);
        std::allocator<char>::~allocator((allocator<char> *)&local_d99);
        std::__cxx11::string::~string((string *)&local_d70);
        std::allocator<char>::~allocator((allocator<char> *)&local_d71);
        std::__cxx11::string::~string((string *)&local_d48);
        std::allocator<char>::~allocator((allocator<char> *)&local_d49);
        std::__cxx11::string::~string((string *)&local_d20);
        std::allocator<char>::~allocator((allocator<char> *)&local_d21);
        std::__cxx11::string::~string((string *)&local_cf8);
        std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
        std::__cxx11::string::~string((string *)&local_cd8);
        std::__cxx11::string::~string((string *)&local_cb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c48);
      }
      std::__cxx11::string::~string
                ((string *)
                 &commandLines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(rspcontent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rspfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();
  std::string ruleName = this->LanguageLinkerRule();

  // Select whether to use a response file for objects.
  std::string rspfile;
  std::string rspcontent;

  if (!this->GetGlobalGenerator()->HasRule(ruleName)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());

    vars.Language = this->TargetLinkLanguage.c_str();

    std::string responseFlag;
    if (!useResponseFile) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      std::string cmakeVarLang = "CMAKE_";
      cmakeVarLang += this->TargetLinkLanguage;

      // build response file name
      std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
      const char* flag = GetMakefile()->GetDefinition(cmakeLinkVar);
      if (flag) {
        responseFlag = flag;
      } else {
        responseFlag = "@";
      }
      rspfile = "$RSP_FILE";
      responseFlag += rspfile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rspcontent = "$in";
      } else {
        rspcontent = "$in_newline";
      }
      rspcontent += " $LINK_PATH $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string launcher;
    const char* val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd();
    for (std::vector<std::string>::iterator i = linkCmds.begin();
         i != linkCmds.end(); ++i) {
      *i = launcher + *i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   *i, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cmEraseIf(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.push_back("$POST_BUILD");
    std::string linkCmd =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds);

    // Write the linker rule with response file if needed.
    std::ostringstream comment;
    comment << "Rule for linking " << this->TargetLinkLanguage << " "
            << this->GetVisibleTypeName() << ".";
    std::ostringstream description;
    description << "Linking " << this->TargetLinkLanguage << " "
                << this->GetVisibleTypeName() << " $TARGET_FILE";
    this->GetGlobalGenerator()->AddRule(ruleName, linkCmd, description.str(),
                                        comment.str(),
                                        /*depfile*/ "",
                                        /*deptype*/ "", rspfile, rspcontent,
                                        /*restat*/ "$RESTAT",
                                        /*generator*/ false);
  }

  if (this->TargetNameOut != this->TargetNameReal &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_executable $in $out");
      commandLines.push_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_EXECUTABLE",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating executable symlink $out", "Rule for creating "
                                            "executable symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    } else {
      std::vector<std::string> commandLines;
      commandLines.push_back(cmakeCommand +
                             " -E cmake_symlink_library $in $SONAME $out");
      commandLines.push_back("$POST_BUILD");

      this->GetGlobalGenerator()->AddRule(
        "CMAKE_SYMLINK_LIBRARY",
        this->GetLocalGenerator()->BuildCommandLine(commandLines),
        "Creating library symlink $out", "Rule for creating "
                                         "library symlink.",
        /*depfile*/ "",
        /*deptype*/ "",
        /*rspfile*/ "",
        /*rspcontent*/ "",
        /*restat*/ "",
        /*generator*/ false);
    }
  }
}